

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkComputeLevelR(Acb_Ntk_t *p,Vec_Int_t *vTfi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((p->vLevelR).nSize < 1) {
    Vec_IntFill(&p->vLevelR,(p->vObjType).nCap,0);
  }
  iVar3 = vTfi->nSize;
  while (0 < iVar3) {
    iVar3 = iVar3 + -1;
    iVar1 = Vec_IntEntry(vTfi,iVar3);
    Acb_ObjComputeLevelR(p,iVar1);
  }
  iVar3 = 0;
  for (iVar1 = 0; iVar1 < (p->vCis).nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(&p->vCis,iVar1);
    iVar2 = Acb_ObjLevelR(p,iVar2);
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
  }
  p->LevelMax = iVar3;
  return iVar3;
}

Assistant:

int Acb_NtkComputeLevelR( Acb_Ntk_t * p, Vec_Int_t * vTfi )
{
    // it is assumed that vTfi contains CI nodes
    int i, iObj, Level = 0;
    if ( !Acb_NtkHasObjLevelR( p ) )
        Acb_NtkCleanObjLevelR( p );
    Vec_IntForEachEntryReverse( vTfi, iObj, i )
        Acb_ObjComputeLevelR( p, iObj );
    Acb_NtkForEachCi( p, iObj, i )
        Level = Abc_MaxInt( Level, Acb_ObjLevelR(p, iObj) );
//    assert( p->LevelMax == Level );
    p->LevelMax = Level;
    return Level;
}